

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O0

void jieba_add_user_word(jieba_t *handle,char *word)

{
  char *in_RSI;
  string *in_stack_ffffffffffffff68;
  Jieba *this;
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,&local_31);
  this = (Jieba *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_69 + 1),"",(allocator *)this);
  cppjieba::Jieba::InsertUserWord(this,in_stack_ffffffffffffff68,(string *)0x13e801);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void jieba_add_user_word(jieba_t* handle, const char* word) {
  ((cppjieba::Jieba*)handle)->InsertUserWord(word);
}